

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

void __thiscall
pybind11::arg_v::arg_v<SupportType>(arg_v *this,arg *base,SupportType *x,char *descr)

{
  undefined8 uVar1;
  long lVar2;
  undefined8 in_RCX;
  itype *in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  return_value_policy in_stack_ffffffffffffff9f;
  handle parent;
  handle local_30;
  PyObject *local_28;
  undefined8 local_20;
  
  uVar1 = in_RSI[1];
  *in_RDI = *in_RSI;
  in_RDI[1] = uVar1;
  parent.m_ptr = (PyObject *)(in_RDI + 2);
  local_30.m_ptr = (PyObject *)0x0;
  local_20 = in_RCX;
  pybind11::handle::handle(&local_30);
  local_28 = (PyObject *)
             pybind11::detail::type_caster_base<SupportType>::cast
                       (in_RDX,in_stack_ffffffffffffff9f,parent);
  reinterpret_steal<pybind11::object>(parent);
  in_RDI[3] = local_20;
  lVar2 = PyErr_Occurred();
  if (lVar2 != 0) {
    PyErr_Clear();
  }
  return;
}

Assistant:

arg_v(arg &&base, T &&x, const char *descr = nullptr)
        : arg(base),
          value(reinterpret_steal<object>(
              detail::make_caster<T>::cast(x, return_value_policy::automatic, {})
          )),
          descr(descr)
#if !defined(NDEBUG)
        , type(type_id<T>())
#endif
    {
        // Workaround! See:
        // https://github.com/pybind/pybind11/issues/2336
        // https://github.com/pybind/pybind11/pull/2685#issuecomment-731286700
        if (PyErr_Occurred()) {
            PyErr_Clear();
        }
    }